

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementSpring.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementSpring::SetNodes
          (ChElementSpring *this,shared_ptr<chrono::fea::ChNodeFEAxyz> *nodeA,
          shared_ptr<chrono::fea::ChNodeFEAxyz> *nodeB)

{
  vector<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_> mvars;
  _Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_> local_48;
  ChVariables *local_30;
  _Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_> local_28;
  
  std::__shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&((this->nodes).
               super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
              super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>,
             &nodeA->super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->nodes).
              super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
              ._M_impl.super__Vector_impl_data._M_start[1].
              super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>,
             &nodeB->super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>);
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_30 = (ChVariables *)
             (**(code **)(*(long *)&((((this->nodes).
                                       super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->
                                     super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                                     )._M_ptr)->super_ChNodeFEAbase + 0x40))();
  std::vector<chrono::ChVariables*,std::allocator<chrono::ChVariables*>>::
  emplace_back<chrono::ChVariables*>
            ((vector<chrono::ChVariables*,std::allocator<chrono::ChVariables*>> *)&local_48,
             &local_30);
  local_30 = (ChVariables *)
             (**(code **)(*(long *)&((this->nodes).
                                     super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[1].
                                     super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr)->super_ChNodeFEAbase + 0x40))();
  std::vector<chrono::ChVariables*,std::allocator<chrono::ChVariables*>>::
  emplace_back<chrono::ChVariables*>
            ((vector<chrono::ChVariables*,std::allocator<chrono::ChVariables*>> *)&local_48,
             &local_30);
  std::vector<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>::vector
            ((vector<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_> *)&local_28,
             (vector<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_> *)&local_48);
  ChKblockGeneric::SetVariables
            (&(this->super_ChElementGeneric).Kmatr,
             (vector<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_> *)&local_28);
  std::_Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>::~_Vector_base
            (&local_28);
  std::_Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>::~_Vector_base
            (&local_48);
  return;
}

Assistant:

void ChElementSpring::SetNodes(std::shared_ptr<ChNodeFEAxyz> nodeA, std::shared_ptr<ChNodeFEAxyz> nodeB) {
    nodes[0] = nodeA;
    nodes[1] = nodeB;
    std::vector<ChVariables*> mvars;
    mvars.push_back(&nodes[0]->Variables());
    mvars.push_back(&nodes[1]->Variables());
    Kmatr.SetVariables(mvars);
}